

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  int iVar1;
  stbi__context *in_RCX;
  undefined4 *in_RDX;
  uchar *in_RSI;
  undefined4 *in_RDI;
  int in_R8D;
  stbi__context *in_R9;
  stbi_uc *out;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  stbi_uc *local_8;
  
  iVar1 = stbi__pnm_info(in_RCX,(int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),(int *)in_R9,
                         in_stack_ffffffffffffffc0);
  if (iVar1 == 0) {
    local_8 = (stbi_uc *)0x0;
  }
  else {
    *(undefined4 *)in_RSI = *in_RDI;
    *in_RDX = in_RDI[1];
    if (in_RCX != (stbi__context *)0x0) {
      in_RCX->img_x = in_RDI[2];
    }
    iVar1 = stbi__mad3sizes_valid
                      ((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                       (int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                       in_stack_ffffffffffffffb8);
    if (iVar1 == 0) {
      stbi__err("too large");
      local_8 = (stbi_uc *)0x0;
    }
    else {
      local_8 = (stbi_uc *)
                stbi__malloc_mad3(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0,0x42eacc);
      if (local_8 == (stbi_uc *)0x0) {
        stbi__err("outofmem");
        local_8 = (stbi_uc *)0x0;
      }
      else {
        stbi__getn(in_R9,local_8,in_stack_ffffffffffffffbc);
        if ((in_R8D != 0) && (in_R8D != in_RDI[2])) {
          local_8 = stbi__convert_format
                              (in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                               (uint)((ulong)in_RCX >> 0x20),(uint)in_RCX);
        }
      }
    }
  }
  return local_8;
}

Assistant:

static void *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   STBI_NOTUSED(ri);

   if (!stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n))
      return 0;

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;

   if (!stbi__mad3sizes_valid(s->img_n, s->img_x, s->img_y, 0))
      return stbi__errpuc("too large", "PNM too large");

   out = (stbi_uc *) stbi__malloc_mad3(s->img_n, s->img_x, s->img_y, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   stbi__getn(s, out, s->img_n * s->img_x * s->img_y);

   if (req_comp && req_comp != s->img_n) {
      out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}